

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

void __thiscall icu_63::ICUService::ICUService(ICUService *this)

{
  ICUService *this_local;
  
  ICUNotifier::ICUNotifier(&this->super_ICUNotifier);
  (this->super_ICUNotifier)._vptr_ICUNotifier = (_func_int **)&PTR__ICUService_004b2030;
  UnicodeString::UnicodeString(&this->name);
  this->timestamp = 0;
  this->factories = (UVector *)0x0;
  this->serviceCache = (Hashtable *)0x0;
  this->idCache = (Hashtable *)0x0;
  this->dnCache = (DNCache *)0x0;
  return;
}

Assistant:

ICUService::ICUService()
: name()
, timestamp(0)
, factories(NULL)
, serviceCache(NULL)
, idCache(NULL)
, dnCache(NULL)
{
}